

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O2

optional<kernel::CCoinsStats> *
kernel::ComputeUTXOStats
          (optional<kernel::CCoinsStats> *__return_storage_ptr__,CoinStatsHashType hash_type,
          CCoinsView *view,BlockManager *blockman,function<void_()> *interruption_point)

{
  long lVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char cVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  CBlockIndex *pCVar11;
  CBlockIndex **ppCVar12;
  mapped_type *pmVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar14;
  char *__function;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_00;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_01;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_02;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_03;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_04;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_05;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_06;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_07;
  CSHA256 *pCVar15;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *hash;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *pmVar16;
  long in_FS_OFFSET;
  byte bVar17;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  CBlockIndex *pindex;
  long *local_7c0;
  CCoinsStats stats;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  outputs_2;
  uint256 out;
  COutPoint key;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  outputs;
  Txid prevkey;
  
  bVar17 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock7,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
             ,0x9c,false);
  (*view->_vptr_CCoinsView[2])(&outputs_2,view);
  pCVar11 = ::node::BlockManager::LookupBlockIndex(blockman,(uint256 *)&outputs_2);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  pindex = pCVar11;
  ppCVar12 = inline_assertion_check<true,CBlockIndex*&>
                       (&pindex,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
                        ,0x9d,"ComputeUTXOStats","pindex");
  iVar10 = (*ppCVar12)->nHeight;
  CBlockIndex::GetBlockHash((uint256 *)&outputs_2,pindex);
  CCoinsStats::CCoinsStats(&stats,iVar10,(uint256 *)&outputs_2);
  if (hash_type == NONE) {
    (*view->_vptr_CCoinsView[5])(&key);
    if (key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
      outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &outputs_2._M_t._M_impl.super__Rb_tree_header._M_header;
      outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      outputs_2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      out.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (cVar7 = (**(code **)(*(long *)key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems.
                                           _0_8_ + 0x20))(), cVar7 != '\0') {
        if ((interruption_point->super__Function_base)._M_manager != (_Manager_type)0x0) {
          std::function<void_()>::operator()(interruption_point);
        }
        outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        outputs._M_t._M_impl._0_8_ = 0;
        outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outputs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)
             CONCAT44(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,0xffffffff
                     );
        Coin::Coin((Coin *)&criticalblock7);
        cVar8 = (**(code **)(*(long *)key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_
                            + 0x10))
                          (key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_,&outputs);
        if ((cVar8 == '\0') ||
           (cVar8 = (**(code **)(*(long *)key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems.
                                          _0_8_ + 0x18))
                              (key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_,
                               (Coin *)&criticalblock7), cVar8 == '\0')) {
          logging_function_00._M_str = "ComputeUTXOStats";
          logging_function_00._M_len = 0x10;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
          ;
          source_file_00._M_len = 100;
          LogPrintFormatInternal<char[17]>
                    (logging_function_00,source_file_00,0x89,ALL,Error,
                     (ConstevalFormatString<1U>)0x6cf739,(char (*) [17])"ComputeUTXOStats");
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     &criticalblock7.super_unique_lock._M_owns);
          goto LAB_003dc883;
        }
        if ((outputs_2._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
           (bVar9 = transaction_identifier<false>::operator!=
                              ((transaction_identifier<false> *)&outputs,
                               (transaction_identifier<false> *)&out), bVar9)) {
          hash = &outputs_2._M_t;
          ApplyStats(&stats,(uint256 *)&outputs_2._M_t,outputs_05);
          ApplyHash<decltype(nullptr)>((void **)&outputs_2._M_t,(Txid *)hash,outputs_06);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
          ::clear(&outputs_2._M_t);
        }
        out.super_base_blob<256U>.m_data._M_elems._16_8_ =
             outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        out.super_base_blob<256U>.m_data._M_elems._24_8_ =
             outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        out.super_base_blob<256U>.m_data._M_elems[0] = outputs._M_t._M_impl._0_1_;
        out.super_base_blob<256U>.m_data._M_elems[1] = outputs._M_t._M_impl._1_1_;
        out.super_base_blob<256U>.m_data._M_elems[2] = outputs._M_t._M_impl._2_1_;
        out.super_base_blob<256U>.m_data._M_elems[3] = outputs._M_t._M_impl._3_1_;
        out.super_base_blob<256U>.m_data._M_elems[4] = outputs._M_t._M_impl._4_1_;
        out.super_base_blob<256U>.m_data._M_elems[5] = outputs._M_t._M_impl._5_1_;
        out.super_base_blob<256U>.m_data._M_elems[6] = outputs._M_t._M_impl._6_1_;
        out.super_base_blob<256U>.m_data._M_elems[7] = outputs._M_t._M_impl._7_1_;
        out.super_base_blob<256U>.m_data._M_elems._8_8_ =
             outputs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        pmVar13 = std::
                  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                  ::operator[]((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                                *)&outputs_2._M_t,
                               (key_type_conflict1 *)
                               &outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
        Coin::operator=(pmVar13,(Coin *)&criticalblock7);
        stats.coins_count = stats.coins_count + 1;
        (**(code **)(*(long *)key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x28)
        )();
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   &criticalblock7.super_unique_lock._M_owns);
      }
      if (outputs_2._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        pmVar16 = &outputs_2;
        ApplyStats(&stats,(uint256 *)&outputs_2,outputs_04);
        ApplyHash<decltype(nullptr)>((void **)&outputs_2,(Txid *)pmVar16,outputs_07);
      }
      iVar10 = (*view->_vptr_CCoinsView[8])();
      stats.nDiskSize = CONCAT44(extraout_var_00,iVar10);
LAB_003dc883:
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
      ::~_Rb_tree(&outputs_2._M_t);
      if (key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
        (**(code **)(*(long *)key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ + 8))()
        ;
      }
joined_r0x003dc8ab:
      if (cVar7 == '\0') {
        memcpy(__return_storage_ptr__,&stats,0xd0);
      }
      (__return_storage_ptr__->super__Optional_base<kernel::CCoinsStats,_true,_true>)._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_engaged = cVar7 == '\0';
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    __function = 
    "bool kernel::ComputeUTXOStats(CCoinsView *, CCoinsStats &, T, const std::function<void ()> &) [T = std::nullptr_t]"
    ;
  }
  else if (hash_type == MUHASH) {
    MuHash3072::MuHash3072((MuHash3072 *)&criticalblock7);
    memcpy(&outputs_2,(MuHash3072 *)&criticalblock7,0x300);
    (*view->_vptr_CCoinsView[5])(&local_7c0);
    if (local_7c0 != (long *)0x0) {
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &outputs._M_t._M_impl.super__Rb_tree_header._M_header;
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (ulong)(uint)outputs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      outputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (cVar7 = (**(code **)(*local_7c0 + 0x20))(), cVar7 != '\0') {
        if ((interruption_point->super__Function_base)._M_manager != (_Manager_type)0x0) {
          std::function<void_()>::operator()(interruption_point);
        }
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        key.n = 0xffffffff;
        Coin::Coin((Coin *)&out);
        cVar8 = (**(code **)(*local_7c0 + 0x10))(local_7c0,&key);
        if ((cVar8 == '\0') ||
           (cVar8 = (**(code **)(*local_7c0 + 0x18))(local_7c0,(Coin *)&out), cVar8 == '\0')) {
          logging_function._M_str = "ComputeUTXOStats";
          logging_function._M_len = 0x10;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
          ;
          source_file._M_len = 100;
          LogPrintFormatInternal<char[17]>
                    (logging_function,source_file,0x89,ALL,Error,(ConstevalFormatString<1U>)0x6cf739
                     ,(char (*) [17])"ComputeUTXOStats");
          goto LAB_003dc7bd;
        }
        if ((outputs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
           (bVar9 = transaction_identifier<false>::operator!=(&key.hash,&prevkey), bVar9)) {
          ApplyStats(&stats,(uint256 *)&outputs._M_t,outputs_03);
          ApplyHash<MuHash3072>
                    ((MuHash3072 *)&outputs_2,&prevkey,
                     (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                      *)&outputs._M_t);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
          ::clear(&outputs._M_t);
        }
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
        pmVar13 = std::
                  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                  ::operator[]((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                                *)&outputs._M_t,&key.n);
        Coin::operator=(pmVar13,(Coin *)&out);
        stats.coins_count = stats.coins_count + 1;
        (**(code **)(*local_7c0 + 0x28))();
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   (out.super_base_blob<256U>.m_data._M_elems + 8));
      }
      if (outputs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        ApplyStats(&stats,(uint256 *)&outputs,outputs_02);
        ApplyHash<MuHash3072>((MuHash3072 *)&outputs_2,&prevkey,&outputs);
      }
      out.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      MuHash3072::Finalize((MuHash3072 *)&outputs_2,&out);
      uVar6 = out.super_base_blob<256U>.m_data._M_elems._24_8_;
      uVar5 = out.super_base_blob<256U>.m_data._M_elems._16_8_;
      uVar4 = out.super_base_blob<256U>.m_data._M_elems._8_8_;
      uVar3 = out.super_base_blob<256U>.m_data._M_elems._0_8_;
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x10] =
           out.super_base_blob<256U>.m_data._M_elems[0x10];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x11] =
           out.super_base_blob<256U>.m_data._M_elems[0x11];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x12] =
           out.super_base_blob<256U>.m_data._M_elems[0x12];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x13] =
           out.super_base_blob<256U>.m_data._M_elems[0x13];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x14] =
           out.super_base_blob<256U>.m_data._M_elems[0x14];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x15] =
           out.super_base_blob<256U>.m_data._M_elems[0x15];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x16] =
           out.super_base_blob<256U>.m_data._M_elems[0x16];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x17] =
           out.super_base_blob<256U>.m_data._M_elems[0x17];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x18] =
           out.super_base_blob<256U>.m_data._M_elems[0x18];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x19] =
           out.super_base_blob<256U>.m_data._M_elems[0x19];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1a] =
           out.super_base_blob<256U>.m_data._M_elems[0x1a];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1b] =
           out.super_base_blob<256U>.m_data._M_elems[0x1b];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1c] =
           out.super_base_blob<256U>.m_data._M_elems[0x1c];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1d] =
           out.super_base_blob<256U>.m_data._M_elems[0x1d];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1e] =
           out.super_base_blob<256U>.m_data._M_elems[0x1e];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1f] =
           out.super_base_blob<256U>.m_data._M_elems[0x1f];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0] =
           out.super_base_blob<256U>.m_data._M_elems[0];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[1] =
           out.super_base_blob<256U>.m_data._M_elems[1];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[2] =
           out.super_base_blob<256U>.m_data._M_elems[2];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[3] =
           out.super_base_blob<256U>.m_data._M_elems[3];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[4] =
           out.super_base_blob<256U>.m_data._M_elems[4];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[5] =
           out.super_base_blob<256U>.m_data._M_elems[5];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[6] =
           out.super_base_blob<256U>.m_data._M_elems[6];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[7] =
           out.super_base_blob<256U>.m_data._M_elems[7];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[8] =
           out.super_base_blob<256U>.m_data._M_elems[8];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[9] =
           out.super_base_blob<256U>.m_data._M_elems[9];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[10] =
           out.super_base_blob<256U>.m_data._M_elems[10];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xb] =
           out.super_base_blob<256U>.m_data._M_elems[0xb];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xc] =
           out.super_base_blob<256U>.m_data._M_elems[0xc];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xd] =
           out.super_base_blob<256U>.m_data._M_elems[0xd];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xe] =
           out.super_base_blob<256U>.m_data._M_elems[0xe];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xf] =
           out.super_base_blob<256U>.m_data._M_elems[0xf];
      out.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar3;
      out.super_base_blob<256U>.m_data._M_elems._8_8_ = uVar4;
      out.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar5;
      out.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar6;
      iVar10 = (*view->_vptr_CCoinsView[8])();
      stats.nDiskSize = CONCAT44(extraout_var,iVar10);
LAB_003dc943:
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
      ::~_Rb_tree(&outputs._M_t);
      if (local_7c0 != (long *)0x0) {
        (**(code **)(*local_7c0 + 8))();
      }
      goto joined_r0x003dc8ab;
    }
    __function = 
    "bool kernel::ComputeUTXOStats(CCoinsView *, CCoinsStats &, T, const std::function<void ()> &) [T = MuHash3072]"
    ;
  }
  else {
    if (hash_type != HASH_SERIALIZED) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
                    ,0xad,
                    "auto kernel::ComputeUTXOStats(CoinStatsHashType, CCoinsView *, node::BlockManager &, const std::function<void ()> &)::(anonymous class)::operator()() const"
                   );
    }
    criticalblock7.super_unique_lock._M_device = (mutex_type *)0x0;
    criticalblock7.super_unique_lock._M_owns = false;
    criticalblock7.super_unique_lock._9_7_ = 0;
    CSHA256::CSHA256((CSHA256 *)&criticalblock7);
    pCVar15 = (CSHA256 *)&criticalblock7;
    pmVar16 = &outputs_2;
    for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
      uVar2 = pCVar15->s[1];
      *(uint32_t *)&(pmVar16->_M_t)._M_impl.field_0x0 = pCVar15->s[0];
      *(uint32_t *)&(pmVar16->_M_t)._M_impl.field_0x4 = uVar2;
      pCVar15 = (CSHA256 *)((long)pCVar15 + (ulong)bVar17 * -0x10 + 8);
      pmVar16 = (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                 *)((long)pmVar16 + (ulong)bVar17 * -0x10 + 8);
    }
    (*view->_vptr_CCoinsView[5])(&local_7c0);
    if (local_7c0 != (long *)0x0) {
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &outputs._M_t._M_impl.super__Rb_tree_header._M_header;
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (ulong)(uint)outputs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      outputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_003dc2c9:
      cVar7 = (**(code **)(*local_7c0 + 0x20))();
      if (cVar7 == '\0') {
        if (outputs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ApplyStats(&stats,(uint256 *)&outputs,outputs_00);
          ApplyHash<HashWriter>((HashWriter *)&outputs_2,&prevkey,&outputs);
        }
        HashWriter::GetHash(&out,(HashWriter *)&outputs_2);
        uVar6 = out.super_base_blob<256U>.m_data._M_elems._24_8_;
        uVar5 = out.super_base_blob<256U>.m_data._M_elems._16_8_;
        uVar4 = out.super_base_blob<256U>.m_data._M_elems._8_8_;
        uVar3 = out.super_base_blob<256U>.m_data._M_elems._0_8_;
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x10] =
             out.super_base_blob<256U>.m_data._M_elems[0x10];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x11] =
             out.super_base_blob<256U>.m_data._M_elems[0x11];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x12] =
             out.super_base_blob<256U>.m_data._M_elems[0x12];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x13] =
             out.super_base_blob<256U>.m_data._M_elems[0x13];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x14] =
             out.super_base_blob<256U>.m_data._M_elems[0x14];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x15] =
             out.super_base_blob<256U>.m_data._M_elems[0x15];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x16] =
             out.super_base_blob<256U>.m_data._M_elems[0x16];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x17] =
             out.super_base_blob<256U>.m_data._M_elems[0x17];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x18] =
             out.super_base_blob<256U>.m_data._M_elems[0x18];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x19] =
             out.super_base_blob<256U>.m_data._M_elems[0x19];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1a] =
             out.super_base_blob<256U>.m_data._M_elems[0x1a];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1b] =
             out.super_base_blob<256U>.m_data._M_elems[0x1b];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1c] =
             out.super_base_blob<256U>.m_data._M_elems[0x1c];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1d] =
             out.super_base_blob<256U>.m_data._M_elems[0x1d];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1e] =
             out.super_base_blob<256U>.m_data._M_elems[0x1e];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1f] =
             out.super_base_blob<256U>.m_data._M_elems[0x1f];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0] =
             out.super_base_blob<256U>.m_data._M_elems[0];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[1] =
             out.super_base_blob<256U>.m_data._M_elems[1];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[2] =
             out.super_base_blob<256U>.m_data._M_elems[2];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[3] =
             out.super_base_blob<256U>.m_data._M_elems[3];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[4] =
             out.super_base_blob<256U>.m_data._M_elems[4];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[5] =
             out.super_base_blob<256U>.m_data._M_elems[5];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[6] =
             out.super_base_blob<256U>.m_data._M_elems[6];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[7] =
             out.super_base_blob<256U>.m_data._M_elems[7];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[8] =
             out.super_base_blob<256U>.m_data._M_elems[8];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[9] =
             out.super_base_blob<256U>.m_data._M_elems[9];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[10] =
             out.super_base_blob<256U>.m_data._M_elems[10];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xb] =
             out.super_base_blob<256U>.m_data._M_elems[0xb];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xc] =
             out.super_base_blob<256U>.m_data._M_elems[0xc];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xd] =
             out.super_base_blob<256U>.m_data._M_elems[0xd];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xe] =
             out.super_base_blob<256U>.m_data._M_elems[0xe];
        stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xf] =
             out.super_base_blob<256U>.m_data._M_elems[0xf];
        out.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar3;
        out.super_base_blob<256U>.m_data._M_elems._8_8_ = uVar4;
        out.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar5;
        out.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar6;
        iVar10 = (*view->_vptr_CCoinsView[8])();
        stats.nDiskSize = CONCAT44(extraout_var_01,iVar10);
      }
      else {
        if ((interruption_point->super__Function_base)._M_manager != (_Manager_type)0x0) {
          std::function<void_()>::operator()(interruption_point);
        }
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        key.n = 0xffffffff;
        Coin::Coin((Coin *)&out);
        cVar8 = (**(code **)(*local_7c0 + 0x10))(local_7c0,&key);
        if ((cVar8 != '\0') &&
           (cVar8 = (**(code **)(*local_7c0 + 0x18))(local_7c0,(Coin *)&out), cVar8 != '\0'))
        goto code_r0x003dc338;
        logging_function_01._M_str = "ComputeUTXOStats";
        logging_function_01._M_len = 0x10;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
        ;
        source_file_01._M_len = 100;
        LogPrintFormatInternal<char[17]>
                  (logging_function_01,source_file_01,0x89,ALL,Error,
                   (ConstevalFormatString<1U>)0x6cf739,(char (*) [17])"ComputeUTXOStats");
LAB_003dc7bd:
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   (out.super_base_blob<256U>.m_data._M_elems + 8));
      }
      goto LAB_003dc943;
    }
    __function = 
    "bool kernel::ComputeUTXOStats(CCoinsView *, CCoinsStats &, T, const std::function<void ()> &) [T = HashWriter]"
    ;
  }
  __assert_fail("pcursor",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
                ,0x77,__function);
code_r0x003dc338:
  if ((outputs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (bVar9 = transaction_identifier<false>::operator!=(&key.hash,&prevkey), bVar9)) {
    ApplyStats(&stats,(uint256 *)&outputs._M_t,outputs_01);
    ApplyHash<HashWriter>
              ((HashWriter *)&outputs_2,&prevkey,
               (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                *)&outputs._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
    ::clear(&outputs._M_t);
  }
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
  prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
  pmVar13 = std::
            map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
            ::operator[]((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                          *)&outputs._M_t,&key.n);
  Coin::operator=(pmVar13,(Coin *)&out);
  stats.coins_count = stats.coins_count + 1;
  (**(code **)(*local_7c0 + 0x28))();
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (out.super_base_blob<256U>.m_data._M_elems + 8));
  goto LAB_003dc2c9;
}

Assistant:

std::optional<CCoinsStats> ComputeUTXOStats(CoinStatsHashType hash_type, CCoinsView* view, node::BlockManager& blockman, const std::function<void()>& interruption_point)
{
    CBlockIndex* pindex = WITH_LOCK(::cs_main, return blockman.LookupBlockIndex(view->GetBestBlock()));
    CCoinsStats stats{Assert(pindex)->nHeight, pindex->GetBlockHash()};

    bool success = [&]() -> bool {
        switch (hash_type) {
        case(CoinStatsHashType::HASH_SERIALIZED): {
            HashWriter ss{};
            return ComputeUTXOStats(view, stats, ss, interruption_point);
        }
        case(CoinStatsHashType::MUHASH): {
            MuHash3072 muhash;
            return ComputeUTXOStats(view, stats, muhash, interruption_point);
        }
        case(CoinStatsHashType::NONE): {
            return ComputeUTXOStats(view, stats, nullptr, interruption_point);
        }
        } // no default case, so the compiler can warn about missing cases
        assert(false);
    }();

    if (!success) {
        return std::nullopt;
    }
    return stats;
}